

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerSettings.cpp
# Opt level: O1

void __thiscall I2cAnalyzerSettings::I2cAnalyzerSettings(I2cAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *paVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  AnalyzerSettingInterfaceChannel *pAVar3;
  ulong uVar4;
  Channel *pCVar5;
  uint uVar6;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__I2cAnalyzerSettings_0010bd68;
  this_00 = &this->mSdaChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  uVar4 = 0xffffffffffffffff;
  Channel::Channel(&this->mSclChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  paVar1 = &this->mSdaChannelInterface;
  (this->mSdaChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mSclChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  pAVar3 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar4);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar3);
  pAVar2 = paVar1->_M_ptr;
  if (pAVar2 != pAVar3) {
    if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    paVar1->_M_ptr = pAVar3;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)paVar1->_M_ptr,"SDA");
  pCVar5 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)paVar1->_M_ptr);
  pAVar3 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar3);
  pAVar2 = (this->mSclChannelInterface)._M_ptr;
  if (pAVar2 != pAVar3) {
    if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    (this->mSclChannelInterface)._M_ptr = pAVar3;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)(this->mSclChannelInterface)._M_ptr,"SCL");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mSclChannelInterface)._M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar6 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar6,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar6,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSclChannel,true);
  return;
}

Assistant:

I2cAnalyzerSettings::I2cAnalyzerSettings() : mSdaChannel( UNDEFINED_CHANNEL ), mSclChannel( UNDEFINED_CHANNEL )
{
    mSdaChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mSdaChannelInterface->SetTitleAndTooltip( "SDA", "Serial Data Line" );
    mSdaChannelInterface->SetChannel( mSdaChannel );

    mSclChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mSclChannelInterface->SetTitleAndTooltip( "SCL", "Serial Clock Line" );
    mSclChannelInterface->SetChannel( mSclChannel );

    AddInterface( mSdaChannelInterface.get() );
    AddInterface( mSclChannelInterface.get() );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mSdaChannel, "SDA", false );
    AddChannel( mSclChannel, "SCL", false );
}